

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::update_unchoke_limit(session_impl *this)

{
  _Atomic_word *p_Var1;
  mutex *pmVar2;
  int iVar3;
  uint uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  uint uVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  torrent *this_01;
  undefined1 local_48 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  performance_warning_t local_34;
  
  pmVar2 = &(this->m_settings).m_mutex;
  _Stack_40._M_pi = _Stack_40._M_pi & 0xffffffffffffff00;
  local_48 = (undefined1  [8])pmVar2;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  _Stack_40._M_pi._0_1_ = true;
  uVar4 = (this->m_settings).m_store.m_ints._M_elems[0x53];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  uVar6 = 0x7fffffff;
  if (uVar4 < 0x7fffffff) {
    uVar6 = uVar4;
  }
  counters::set_value(&this->m_stats_counters,0xfd,(ulong)uVar6);
  _Stack_40._M_pi._0_1_ = false;
  local_48 = (undefined1  [8])pmVar2;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  _Stack_40._M_pi._0_1_ = 1;
  iVar9 = (this->m_settings).m_store.m_ints._M_elems[0x47];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  if (((int)(uVar6 >> 1) <= iVar9) && (((this->m_alerts).m_alert_mask._M_i.m_val >> 9 & 1) != 0)) {
    local_48 = (undefined1  [8])0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_34 = too_many_optimistic_unchoke_slots;
    alert_manager::
    emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
              (&this->m_alerts,(torrent_handle *)local_48,&local_34);
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(_Stack_40._M_pi)->_M_weak_count;
        iVar9 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = (_Stack_40._M_pi)->_M_weak_count;
        (_Stack_40._M_pi)->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*(_Stack_40._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  _Stack_40._M_pi = _Stack_40._M_pi & 0xffffffffffffff00;
  local_48 = (undefined1  [8])pmVar2;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
  _Stack_40._M_pi._0_1_ = true;
  iVar9 = (this->m_settings).m_store.m_ints._M_elems[0x1f];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  if (iVar9 == 0) {
    if (uVar4 < 0x7fffffff) {
      this->m_unchoke_time_scaler = 0;
    }
    else {
      p_Var10 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var11 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var10 != p_Var11) {
        do {
          cVar7 = (**(code **)(**(long **)(p_Var10 + 1) + 8))();
          if ((((cVar7 == '\0') && ((*(byte *)(*(long **)(p_Var10 + 1) + 6) & 2) == 0)) &&
              (cVar7 = (**(code **)(**(long **)(p_Var10 + 1) + 0x60))(), cVar7 != '\0')) &&
             ((cVar7 = (**(code **)(**(long **)(p_Var10 + 1) + 0xd8))(), cVar7 == '\0' &&
              (bVar8 = peer_connection::ignore_unchoke_slots(*(peer_connection **)(p_Var10 + 1)),
              !bVar8)))) {
            this_01 = *(torrent **)(*(long *)(p_Var10 + 1) + 0x10);
            p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      (*(long *)(p_Var10 + 1) + 0x18);
            this_00 = p_Var5;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                p_Var5->_M_weak_count = p_Var5->_M_weak_count + 1;
              }
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                iVar9 = p_Var5->_M_use_count;
                do {
                  if (iVar9 == 0) {
                    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    break;
                  }
                  LOCK();
                  iVar3 = p_Var5->_M_use_count;
                  bVar8 = iVar9 == iVar3;
                  if (bVar8) {
                    p_Var5->_M_use_count = iVar9 + 1;
                    iVar3 = iVar9;
                  }
                  iVar9 = iVar3;
                  UNLOCK();
                } while (!bVar8);
              }
            }
            if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              this_01 = (torrent *)0x0;
            }
            else if (this_00->_M_use_count == 0) {
              this_01 = (torrent *)0x0;
            }
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &p_Var5->_M_weak_count;
                iVar9 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar9 = p_Var5->_M_weak_count;
                p_Var5->_M_weak_count = iVar9 + -1;
              }
              if (iVar9 == 1) {
                (*p_Var5->_vptr__Sp_counted_base[3])();
              }
            }
            torrent::unchoke_peer(this_01,*(peer_connection **)(p_Var10 + 1),false);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var11);
      }
    }
  }
  return;
}

Assistant:

void session_impl::update_unchoke_limit()
	{
		int const allowed_upload_slots = get_int_setting(settings_pack::unchoke_slots_limit);

		m_stats_counters.set_value(counters::num_unchoke_slots
			, allowed_upload_slots);

		if (m_settings.get_int(settings_pack::num_optimistic_unchoke_slots)
			>= allowed_upload_slots / 2)
		{
			if (m_alerts.should_post<performance_alert>())
				m_alerts.emplace_alert<performance_alert>(torrent_handle()
					, performance_alert::too_many_optimistic_unchoke_slots);
		}

		if (settings().get_int(settings_pack::choking_algorithm) != settings_pack::fixed_slots_choker)
			return;

		if (allowed_upload_slots == std::numeric_limits<int>::max())
		{
			// this means we're not applying upload slot limits, unchoke
			// everyone
			for (auto const& p : m_connections)
			{
				if (p->is_disconnecting()
					|| p->is_connecting()
					|| !p->is_choked()
					|| p->in_handshake()
					|| p->ignore_unchoke_slots()
					)
					continue;

				auto const t = p->associated_torrent().lock();
				t->unchoke_peer(*p);
			}
		}
		else
		{
			// trigger recalculating unchoke slots
			m_unchoke_time_scaler = 0;
		}
	}